

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

bool __thiscall r_exec::PGMOverlay::is_invalidated(PGMOverlay *this)

{
  bool bVar1;
  uint uVar2;
  reference p;
  View *pVVar3;
  Code *pCVar4;
  __int_type_conflict _Var5;
  P<r_code::View> local_38;
  P<r_code::View> input_view;
  iterator __end2;
  iterator __begin2;
  vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_> *__range2;
  PGMOverlay *this_local;
  
  if ((this->is_volatile & 1U) != 0) {
    __end2 = std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::begin
                       (&this->input_views);
    input_view.object =
         (_Object *)
         std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::end
                   (&this->input_views);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<core::P<r_code::View>_*,_std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>_>
                                       *)&input_view), bVar1) {
      p = __gnu_cxx::
          __normal_iterator<core::P<r_code::View>_*,_std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>_>
          ::operator*(&__end2);
      core::P<r_code::View>::P(&local_38,p);
      pVVar3 = core::P<r_code::View>::operator->(&local_38);
      pCVar4 = core::P<r_code::Code>::operator->(&pVVar3->object);
      uVar2 = (*(pCVar4->super__Object)._vptr__Object[0xe])();
      bVar1 = (uVar2 & 1) != 0;
      if (bVar1) {
        _Var5 = std::__atomic_base<unsigned_long>::operator=
                          (&(this->super_InputLessPGMOverlay).super_Overlay.invalidated.
                            super___atomic_base<unsigned_long>,1);
        this_local._7_1_ = _Var5 != 0;
      }
      core::P<r_code::View>::~P(&local_38);
      if (bVar1) goto LAB_00298939;
      __gnu_cxx::
      __normal_iterator<core::P<r_code::View>_*,_std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>_>
      ::operator++(&__end2);
    }
  }
  _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base *)&(this->super_InputLessPGMOverlay).super_Overlay.invalidated);
  this_local._7_1_ = _Var5 == 1;
LAB_00298939:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PGMOverlay::is_invalidated()
{
    if (is_volatile) {
        for (P<r_code::View> input_view : input_views) {
            if (input_view->object->is_invalidated()) {
                return (invalidated = 1);
            }
        }
    }

    return invalidated == 1;
}